

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.h
# Opt level: O2

int __thiscall despot::Floor::GetIndex(Floor *this,int x,int y)

{
  int *piVar1;
  
  piVar1 = (int *)&INVALID;
  if ((((-1 < x) && (-1 < y)) && (x < this->num_cols_)) && (y < this->num_rows_)) {
    piVar1 = this->floor_[(uint)y] + (uint)x;
  }
  return *piVar1;
}

Assistant:

inline int GetIndex(int x, int y) const {
		return
			(x >= 0 && x < num_cols_ && y >= 0 && y < num_rows_) ?
				floor_[y][x] : INVALID;
	}